

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O3

bool hasValidNodes(Network *nw)

{
  pointer ppNVar1;
  pointer ppNVar2;
  
  ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar2 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar2 != ppNVar1; ppNVar2 = ppNVar2 + 1) {
    (*((*ppNVar2)->super_Element)._vptr_Element[0xb])(*ppNVar2,nw);
  }
  return true;
}

Assistant:

bool hasValidNodes(Network* nw)
{
    bool result = true;
    for (Node* node : nw->nodes )
    {
        try
        {
            node->validate(nw);
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
            result = false;
        }
    }
    return result;
}